

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-node.h
# Opt level: O0

void __thiscall mp::pre::ValueNode::CleanUpAndRealloc(ValueNode *this)

{
  ValueNode *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  ValueNode *__new_size;
  
  __new_size = in_RDI;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x18488c);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x18489a);
  Size(in_RDI);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,(size_type)__new_size);
  Size(in_RDI);
  std::vector<double,_std::allocator<double>_>::resize(unaff_retaddr,(size_type)__new_size);
  return;
}

Assistant:

void CleanUpAndRealloc() {
    vi_.clear(); vd_.clear();
    vi_.resize(Size()); vd_.resize(Size());
  }